

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  long lVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined4 uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong unaff_R12;
  size_t mask;
  ulong uVar43;
  long lVar44;
  int iVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar63;
  float fVar64;
  vint4 bi;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  vint4 ai;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 local_a48 [16];
  int local_a2c;
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  ulong local_9f0;
  undefined1 local_9e8 [16];
  Scene *local_9d8;
  undefined8 uStack_9d0;
  ulong local_9c0;
  ulong local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  ulong local_9a0;
  NodeRef *local_998;
  RayQueryContext *local_990;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  auVar36 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar51 = ray->tfar;
    if (0.0 <= fVar51) {
      local_998 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar77._8_4_ = 0x7fffffff;
      auVar77._0_8_ = 0x7fffffff7fffffff;
      auVar77._12_4_ = 0x7fffffff;
      auVar77 = vandps_avx((undefined1  [16])aVar2,auVar77);
      auVar79._8_4_ = 0x219392ef;
      auVar79._0_8_ = 0x219392ef219392ef;
      auVar79._12_4_ = 0x219392ef;
      auVar77 = vcmpps_avx(auVar77,auVar79,1);
      auVar77 = vblendvps_avx((undefined1  [16])aVar2,auVar79,auVar77);
      auVar79 = vrcpps_avx(auVar77);
      fVar63 = auVar79._0_4_;
      auVar73._0_4_ = fVar63 * auVar77._0_4_;
      fVar64 = auVar79._4_4_;
      auVar73._4_4_ = fVar64 * auVar77._4_4_;
      fVar65 = auVar79._8_4_;
      auVar73._8_4_ = fVar65 * auVar77._8_4_;
      fVar78 = auVar79._12_4_;
      auVar73._12_4_ = fVar78 * auVar77._12_4_;
      auVar80._8_4_ = 0x3f800000;
      auVar80._0_8_ = &DAT_3f8000003f800000;
      auVar80._12_4_ = 0x3f800000;
      auVar77 = vsubps_avx(auVar80,auVar73);
      auVar74._0_4_ = fVar63 + fVar63 * auVar77._0_4_;
      auVar74._4_4_ = fVar64 + fVar64 * auVar77._4_4_;
      auVar74._8_4_ = fVar65 + fVar65 * auVar77._8_4_;
      auVar74._12_4_ = fVar78 + fVar78 * auVar77._12_4_;
      uVar37 = *(undefined4 *)&(ray->org).field_0;
      auVar81._4_4_ = uVar37;
      auVar81._0_4_ = uVar37;
      auVar81._8_4_ = uVar37;
      auVar81._12_4_ = uVar37;
      uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar82._4_4_ = uVar37;
      auVar82._0_4_ = uVar37;
      auVar82._8_4_ = uVar37;
      auVar82._12_4_ = uVar37;
      uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar84._4_4_ = uVar37;
      auVar84._0_4_ = uVar37;
      auVar84._8_4_ = uVar37;
      auVar84._12_4_ = uVar37;
      auVar73 = vshufps_avx(auVar74,auVar74,0);
      auVar77 = vmovshdup_avx(auVar74);
      auVar80 = vshufps_avx(auVar74,auVar74,0x55);
      auVar79 = vshufpd_avx(auVar74,auVar74,1);
      local_9a0 = (ulong)(auVar74._0_4_ < 0.0) << 4;
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      local_9a8 = (ulong)(auVar77._0_4_ < 0.0) << 4 | 0x20;
      local_9b0 = (ulong)(auVar79._0_4_ < 0.0) << 4 | 0x40;
      local_9b8 = local_9a0 ^ 0x10;
      uVar39 = local_9a8 ^ 0x10;
      uVar43 = local_9b0 ^ 0x10;
      auVar77 = vshufps_avx(auVar4,auVar4,0);
      auVar4 = vshufps_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51),0);
      local_990 = context;
      local_9f0 = uVar43;
      do {
        if (local_998 == stack) {
          return;
        }
        uVar41 = local_998[-1].ptr;
        local_998 = local_998 + -1;
        do {
          if ((uVar41 & 8) == 0) {
            auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + local_9a0),auVar81);
            auVar47._0_4_ = auVar73._0_4_ * auVar79._0_4_;
            auVar47._4_4_ = auVar73._4_4_ * auVar79._4_4_;
            auVar47._8_4_ = auVar73._8_4_ * auVar79._8_4_;
            auVar47._12_4_ = auVar73._12_4_ * auVar79._12_4_;
            auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + local_9a8),auVar82);
            auVar52._0_4_ = auVar80._0_4_ * auVar79._0_4_;
            auVar52._4_4_ = auVar80._4_4_ * auVar79._4_4_;
            auVar52._8_4_ = auVar80._8_4_ * auVar79._8_4_;
            auVar52._12_4_ = auVar80._12_4_ * auVar79._12_4_;
            auVar79 = vpmaxsd_avx(auVar47,auVar52);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + local_9b0),auVar84);
            auVar53._0_4_ = auVar74._0_4_ * auVar47._0_4_;
            auVar53._4_4_ = auVar74._4_4_ * auVar47._4_4_;
            auVar53._8_4_ = auVar74._8_4_ * auVar47._8_4_;
            auVar53._12_4_ = auVar74._12_4_ * auVar47._12_4_;
            auVar47 = vpmaxsd_avx(auVar53,auVar77);
            auVar79 = vpmaxsd_avx(auVar79,auVar47);
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + local_9b8),auVar81);
            auVar54._0_4_ = auVar73._0_4_ * auVar47._0_4_;
            auVar54._4_4_ = auVar73._4_4_ * auVar47._4_4_;
            auVar54._8_4_ = auVar73._8_4_ * auVar47._8_4_;
            auVar54._12_4_ = auVar73._12_4_ * auVar47._12_4_;
            auVar47 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + uVar39),auVar82);
            auVar66._0_4_ = auVar80._0_4_ * auVar47._0_4_;
            auVar66._4_4_ = auVar80._4_4_ * auVar47._4_4_;
            auVar66._8_4_ = auVar80._8_4_ * auVar47._8_4_;
            auVar66._12_4_ = auVar80._12_4_ * auVar47._12_4_;
            auVar47 = vpminsd_avx(auVar54,auVar66);
            auVar52 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + uVar43),auVar84);
            auVar67._0_4_ = auVar74._0_4_ * auVar52._0_4_;
            auVar67._4_4_ = auVar74._4_4_ * auVar52._4_4_;
            auVar67._8_4_ = auVar74._8_4_ * auVar52._8_4_;
            auVar67._12_4_ = auVar74._12_4_ * auVar52._12_4_;
            auVar52 = vpminsd_avx(auVar67,auVar4);
            auVar47 = vpminsd_avx(auVar47,auVar52);
            auVar79 = vpcmpgtd_avx(auVar79,auVar47);
            uVar37 = vmovmskps_avx(auVar79);
            unaff_R12 = (ulong)(byte)((byte)uVar37 ^ 0xf);
          }
          if ((uVar41 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar45 = 4;
            }
            else {
              uVar40 = uVar41 & 0xfffffffffffffff0;
              lVar44 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                }
              }
              iVar45 = 0;
              uVar41 = *(ulong *)(uVar40 + lVar44 * 8);
              uVar42 = unaff_R12 - 1 & unaff_R12;
              if (uVar42 != 0) {
                local_998->ptr = uVar41;
                lVar44 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                  }
                }
                uVar38 = uVar42 - 1;
                while( true ) {
                  local_998 = local_998 + 1;
                  uVar41 = *(ulong *)(uVar40 + lVar44 * 8);
                  uVar38 = uVar38 & uVar42;
                  if (uVar38 == 0) break;
                  local_998->ptr = uVar41;
                  lVar44 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> lVar44 & 1) == 0; lVar44 = lVar44 + 1) {
                    }
                  }
                  uVar42 = uVar38 - 1;
                }
                iVar45 = 0;
              }
            }
          }
          else {
            iVar45 = 6;
          }
        } while (iVar45 == 0);
        if (iVar45 == 6) {
          local_9c0 = (ulong)((uint)uVar41 & 0xf) - 8;
          bVar46 = local_9c0 != 0;
          if (bVar46) {
            uVar41 = uVar41 & 0xfffffffffffffff0;
            uVar40 = 0;
            do {
              lVar44 = uVar40 * 0xb0;
              pfVar1 = (float *)(uVar41 + 0x80 + lVar44);
              fVar15 = *pfVar1;
              fVar16 = pfVar1[1];
              fVar17 = pfVar1[2];
              fVar18 = pfVar1[3];
              pfVar1 = (float *)(uVar41 + 0x40 + lVar44);
              fVar19 = *pfVar1;
              fVar20 = pfVar1[1];
              fVar21 = pfVar1[2];
              fVar22 = pfVar1[3];
              auVar48._0_4_ = fVar15 * fVar19;
              auVar48._4_4_ = fVar16 * fVar20;
              auVar48._8_4_ = fVar17 * fVar21;
              auVar48._12_4_ = fVar18 * fVar22;
              pfVar1 = (float *)(uVar41 + 0x70 + lVar44);
              fVar23 = *pfVar1;
              fVar24 = pfVar1[1];
              fVar25 = pfVar1[2];
              fVar26 = pfVar1[3];
              pfVar1 = (float *)(uVar41 + 0x50 + lVar44);
              fVar27 = *pfVar1;
              fVar28 = pfVar1[1];
              fVar29 = pfVar1[2];
              fVar30 = pfVar1[3];
              auVar55._0_4_ = fVar23 * fVar27;
              auVar55._4_4_ = fVar24 * fVar28;
              auVar55._8_4_ = fVar25 * fVar29;
              auVar55._12_4_ = fVar26 * fVar30;
              local_a48 = vsubps_avx(auVar55,auVar48);
              auVar79 = *(undefined1 (*) [16])(uVar41 + 0x60 + lVar44);
              fVar90 = auVar79._0_4_;
              auVar56._0_4_ = fVar90 * fVar27;
              fVar91 = auVar79._4_4_;
              auVar56._4_4_ = fVar91 * fVar28;
              fVar92 = auVar79._8_4_;
              auVar56._8_4_ = fVar92 * fVar29;
              fVar93 = auVar79._12_4_;
              auVar56._12_4_ = fVar93 * fVar30;
              pfVar1 = (float *)(uVar41 + 0x30 + lVar44);
              fVar31 = *pfVar1;
              fVar32 = pfVar1[1];
              fVar33 = pfVar1[2];
              fVar34 = pfVar1[3];
              auVar68._0_4_ = fVar15 * fVar31;
              auVar68._4_4_ = fVar16 * fVar32;
              auVar68._8_4_ = fVar17 * fVar33;
              auVar68._12_4_ = fVar18 * fVar34;
              local_a18 = vsubps_avx(auVar68,auVar56);
              auVar69._0_4_ = fVar23 * fVar31;
              auVar69._4_4_ = fVar24 * fVar32;
              auVar69._8_4_ = fVar25 * fVar33;
              auVar69._12_4_ = fVar26 * fVar34;
              auVar94._0_4_ = fVar90 * fVar19;
              auVar94._4_4_ = fVar91 * fVar20;
              auVar94._8_4_ = fVar92 * fVar21;
              auVar94._12_4_ = fVar93 * fVar22;
              local_a28 = vsubps_avx(auVar94,auVar69);
              uVar37 = *(undefined4 *)&(ray->org).field_0;
              auVar95._4_4_ = uVar37;
              auVar95._0_4_ = uVar37;
              auVar95._8_4_ = uVar37;
              auVar95._12_4_ = uVar37;
              auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + lVar44),auVar95);
              uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar96._4_4_ = uVar37;
              auVar96._0_4_ = uVar37;
              auVar96._8_4_ = uVar37;
              auVar96._12_4_ = uVar37;
              local_a08 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x10 + lVar44),auVar96);
              uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar97._4_4_ = uVar37;
              auVar97._0_4_ = uVar37;
              auVar97._8_4_ = uVar37;
              auVar97._12_4_ = uVar37;
              local_9e8 = vsubps_avx(*(undefined1 (*) [16])(uVar41 + 0x20 + lVar44),auVar97);
              fVar51 = (ray->dir).field_0.m128[1];
              fVar63 = (ray->dir).field_0.m128[2];
              fVar65 = local_9e8._0_4_;
              auVar98._0_4_ = fVar51 * fVar65;
              fVar6 = local_9e8._4_4_;
              auVar98._4_4_ = fVar51 * fVar6;
              fVar9 = local_9e8._8_4_;
              auVar98._8_4_ = fVar51 * fVar9;
              fVar12 = local_9e8._12_4_;
              auVar98._12_4_ = fVar51 * fVar12;
              fVar78 = local_a08._0_4_;
              auVar99._0_4_ = fVar63 * fVar78;
              fVar7 = local_a08._4_4_;
              auVar99._4_4_ = fVar63 * fVar7;
              fVar10 = local_a08._8_4_;
              auVar99._8_4_ = fVar63 * fVar10;
              fVar13 = local_a08._12_4_;
              auVar99._12_4_ = fVar63 * fVar13;
              auVar47 = vsubps_avx(auVar99,auVar98);
              fVar64 = (ray->dir).field_0.m128[0];
              fVar5 = auVar53._0_4_;
              auVar49._0_4_ = fVar63 * fVar5;
              fVar8 = auVar53._4_4_;
              auVar49._4_4_ = fVar63 * fVar8;
              fVar11 = auVar53._8_4_;
              auVar49._8_4_ = fVar63 * fVar11;
              fVar14 = auVar53._12_4_;
              auVar49._12_4_ = fVar63 * fVar14;
              auVar57._0_4_ = fVar64 * fVar65;
              auVar57._4_4_ = fVar64 * fVar6;
              auVar57._8_4_ = fVar64 * fVar9;
              auVar57._12_4_ = fVar64 * fVar12;
              auVar52 = vsubps_avx(auVar57,auVar49);
              auVar58._0_4_ = fVar64 * fVar78;
              auVar58._4_4_ = fVar64 * fVar7;
              auVar58._8_4_ = fVar64 * fVar10;
              auVar58._12_4_ = fVar64 * fVar13;
              auVar70._0_4_ = fVar51 * fVar5;
              auVar70._4_4_ = fVar51 * fVar8;
              auVar70._8_4_ = fVar51 * fVar11;
              auVar70._12_4_ = fVar51 * fVar14;
              auVar54 = vsubps_avx(auVar70,auVar58);
              auVar71._0_4_ =
                   local_a48._0_4_ * fVar64 + fVar51 * local_a18._0_4_ + fVar63 * local_a28._0_4_;
              auVar71._4_4_ =
                   local_a48._4_4_ * fVar64 + fVar51 * local_a18._4_4_ + fVar63 * local_a28._4_4_;
              auVar71._8_4_ =
                   local_a48._8_4_ * fVar64 + fVar51 * local_a18._8_4_ + fVar63 * local_a28._8_4_;
              auVar71._12_4_ =
                   local_a48._12_4_ * fVar64 + fVar51 * local_a18._12_4_ + fVar63 * local_a28._12_4_
              ;
              auVar59._8_8_ = 0x8000000080000000;
              auVar59._0_8_ = 0x8000000080000000;
              auVar79 = vandps_avx(auVar71,auVar59);
              uVar86 = auVar79._0_4_;
              auVar83._0_4_ =
                   (float)(uVar86 ^ (uint)(fVar90 * auVar47._0_4_ +
                                          fVar15 * auVar54._0_4_ + fVar23 * auVar52._0_4_));
              uVar87 = auVar79._4_4_;
              auVar83._4_4_ =
                   (float)(uVar87 ^ (uint)(fVar91 * auVar47._4_4_ +
                                          fVar16 * auVar54._4_4_ + fVar24 * auVar52._4_4_));
              uVar88 = auVar79._8_4_;
              auVar83._8_4_ =
                   (float)(uVar88 ^ (uint)(fVar92 * auVar47._8_4_ +
                                          fVar17 * auVar54._8_4_ + fVar25 * auVar52._8_4_));
              uVar89 = auVar79._12_4_;
              auVar83._12_4_ =
                   (float)(uVar89 ^ (uint)(fVar93 * auVar47._12_4_ +
                                          fVar18 * auVar54._12_4_ + fVar26 * auVar52._12_4_));
              auVar85._0_4_ =
                   (float)(uVar86 ^ (uint)(fVar31 * auVar47._0_4_ +
                                          fVar27 * auVar54._0_4_ + fVar19 * auVar52._0_4_));
              auVar85._4_4_ =
                   (float)(uVar87 ^ (uint)(fVar32 * auVar47._4_4_ +
                                          fVar28 * auVar54._4_4_ + fVar20 * auVar52._4_4_));
              auVar85._8_4_ =
                   (float)(uVar88 ^ (uint)(fVar33 * auVar47._8_4_ +
                                          fVar29 * auVar54._8_4_ + fVar21 * auVar52._8_4_));
              auVar85._12_4_ =
                   (float)(uVar89 ^ (uint)(fVar34 * auVar47._12_4_ +
                                          fVar30 * auVar54._12_4_ + fVar22 * auVar52._12_4_));
              auVar52 = ZEXT416(0) << 0x20;
              auVar79 = vcmpps_avx(auVar83,auVar52,5);
              auVar47 = vcmpps_avx(auVar85,auVar52,5);
              auVar79 = vandps_avx(auVar79,auVar47);
              auVar60._8_4_ = 0x7fffffff;
              auVar60._0_8_ = 0x7fffffff7fffffff;
              auVar60._12_4_ = 0x7fffffff;
              auVar47 = vandps_avx(auVar71,auVar60);
              auVar52 = vcmpps_avx(auVar52,auVar71,4);
              auVar79 = vandps_avx(auVar79,auVar52);
              auVar61._0_4_ = auVar85._0_4_ + auVar83._0_4_;
              auVar61._4_4_ = auVar85._4_4_ + auVar83._4_4_;
              auVar61._8_4_ = auVar85._8_4_ + auVar83._8_4_;
              auVar61._12_4_ = auVar85._12_4_ + auVar83._12_4_;
              auVar52 = vcmpps_avx(auVar61,auVar47,2);
              auVar79 = vandps_avx(auVar79,auVar52);
              auVar52 = auVar36 & auVar79;
              if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar52[0xf] < '\0') {
                auVar79 = vandps_avx(auVar79,auVar36);
                auVar75._0_4_ =
                     (float)(uVar86 ^ (uint)(local_a48._0_4_ * fVar5 +
                                            fVar78 * local_a18._0_4_ + fVar65 * local_a28._0_4_));
                auVar75._4_4_ =
                     (float)(uVar87 ^ (uint)(local_a48._4_4_ * fVar8 +
                                            fVar7 * local_a18._4_4_ + fVar6 * local_a28._4_4_));
                auVar75._8_4_ =
                     (float)(uVar88 ^ (uint)(local_a48._8_4_ * fVar11 +
                                            fVar10 * local_a18._8_4_ + fVar9 * local_a28._8_4_));
                auVar75._12_4_ =
                     (float)(uVar89 ^ (uint)(local_a48._12_4_ * fVar14 +
                                            fVar13 * local_a18._12_4_ + fVar12 * local_a28._12_4_));
                fVar51 = (ray->org).field_0.m128[3];
                fVar63 = auVar47._0_4_;
                auVar50._0_4_ = fVar63 * fVar51;
                fVar64 = auVar47._4_4_;
                auVar50._4_4_ = fVar64 * fVar51;
                fVar65 = auVar47._8_4_;
                auVar50._8_4_ = fVar65 * fVar51;
                fVar78 = auVar47._12_4_;
                auVar50._12_4_ = fVar78 * fVar51;
                auVar52 = vcmpps_avx(auVar50,auVar75,1);
                fVar51 = ray->tfar;
                auVar62._0_4_ = fVar63 * fVar51;
                auVar62._4_4_ = fVar64 * fVar51;
                auVar62._8_4_ = fVar65 * fVar51;
                auVar62._12_4_ = fVar78 * fVar51;
                auVar54 = vcmpps_avx(auVar75,auVar62,2);
                auVar52 = vandps_avx(auVar54,auVar52);
                auVar54 = auVar79 & auVar52;
                if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar54[0xf] < '\0') {
                  auVar79 = vandps_avx(auVar79,auVar52);
                  local_808 = local_a48;
                  local_7f8 = local_a18._0_8_;
                  uStack_7f0 = local_a18._8_8_;
                  local_7e8 = local_a28._0_8_;
                  uStack_7e0 = local_a28._8_8_;
                  uStack_9d0 = auVar53._8_8_;
                  local_9d8 = local_990->scene;
                  auVar47 = vrcpps_avx(auVar47);
                  fVar51 = auVar47._0_4_;
                  auVar72._0_4_ = fVar63 * fVar51;
                  fVar63 = auVar47._4_4_;
                  auVar72._4_4_ = fVar64 * fVar63;
                  fVar64 = auVar47._8_4_;
                  auVar72._8_4_ = fVar65 * fVar64;
                  fVar65 = auVar47._12_4_;
                  auVar72._12_4_ = fVar78 * fVar65;
                  auVar76._8_4_ = 0x3f800000;
                  auVar76._0_8_ = &DAT_3f8000003f800000;
                  auVar76._12_4_ = 0x3f800000;
                  auVar47 = vsubps_avx(auVar76,auVar72);
                  fVar51 = fVar51 + fVar51 * auVar47._0_4_;
                  fVar63 = fVar63 + fVar63 * auVar47._4_4_;
                  fVar64 = fVar64 + fVar64 * auVar47._8_4_;
                  fVar65 = fVar65 + fVar65 * auVar47._12_4_;
                  local_818[0] = fVar51 * auVar75._0_4_;
                  local_818[1] = fVar63 * auVar75._4_4_;
                  local_818[2] = fVar64 * auVar75._8_4_;
                  local_818[3] = fVar65 * auVar75._12_4_;
                  local_838._0_4_ = fVar51 * auVar83._0_4_;
                  local_838._4_4_ = fVar63 * auVar83._4_4_;
                  local_838._8_4_ = fVar64 * auVar83._8_4_;
                  local_838._12_4_ = fVar65 * auVar83._12_4_;
                  local_828._0_4_ = fVar51 * auVar85._0_4_;
                  local_828._4_4_ = fVar63 * auVar85._4_4_;
                  local_828._8_4_ = fVar64 * auVar85._8_4_;
                  local_828._12_4_ = fVar65 * auVar85._12_4_;
                  uVar37 = vmovmskps_avx(auVar79);
                  uVar43 = CONCAT44((int)((ulong)local_990->scene >> 0x20),uVar37);
                  do {
                    local_a48._0_8_ = uVar43;
                    uVar42 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    local_a28._0_8_ = uVar42;
                    h.geomID = *(uint *)(lVar44 + uVar41 + 0x90 + uVar42 * 4);
                    local_a08._0_8_ = CONCAT44(0,h.geomID);
                    lVar3 = *(long *)(*(long *)((long)local_9d8 + 0x1e8) + CONCAT44(0,h.geomID) * 8)
                    ;
                    local_a18._0_8_ = lVar3;
                    if ((*(uint *)(lVar3 + 0x34) & ray->mask) == 0) {
                      local_a48._0_8_ = uVar43 ^ 1L << (uVar42 & 0x3f);
                      bVar35 = true;
                    }
                    else {
                      local_9e8._0_8_ = local_990->args;
                      if ((local_990->args->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar3 + 0x48) == 0)) {
                        bVar35 = false;
                      }
                      else {
                        h.u = *(float *)(local_838 + uVar42 * 4);
                        h.v = *(float *)(local_828 + uVar42 * 4);
                        args.context = local_990->user;
                        h.primID = *(uint *)(lVar44 + uVar41 + 0xa0 + uVar42 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar42 * 4);
                        h.Ng.field_0.field_0.y = *(float *)((long)&local_7f8 + uVar42 * 4);
                        h.Ng.field_0.field_0.z = *(float *)((long)&local_7e8 + uVar42 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_a08._0_4_ = ray->tfar;
                        ray->tfar = local_818[uVar42];
                        local_a2c = -1;
                        args.valid = &local_a2c;
                        args.geometryUserPtr = *(void **)(lVar3 + 0x18);
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((*(code **)(lVar3 + 0x48) == (code *)0x0) ||
                           ((**(code **)(lVar3 + 0x48))(&args), *args.valid != 0)) {
                          if (*(code **)(local_9e8._0_8_ + 0x10) != (code *)0x0) {
                            if (((*(byte *)local_9e8._0_8_ & 2) != 0) ||
                               ((*(byte *)(local_a18._0_8_ + 0x3e) & 0x40) != 0)) {
                              (**(code **)(local_9e8._0_8_ + 0x10))(&args);
                            }
                            if (*args.valid == 0) goto LAB_002d644b;
                          }
                          bVar35 = false;
                        }
                        else {
LAB_002d644b:
                          ray->tfar = (float)local_a08._0_4_;
                          local_a48._0_8_ = uVar43 ^ 1L << (local_a28._0_8_ & 0x3f);
                          bVar35 = true;
                        }
                      }
                    }
                    if (!bVar35) {
                      iVar45 = 0;
                      uVar43 = local_9f0;
                      if (bVar46) {
                        ray->tfar = -INFINITY;
                        iVar45 = 3;
                      }
                      goto LAB_002d6504;
                    }
                    uVar43 = local_a48._0_8_;
                  } while (local_a48._0_8_ != 0);
                }
              }
              uVar40 = uVar40 + 1;
              bVar46 = uVar40 < local_9c0;
              uVar43 = local_9f0;
            } while (uVar40 != local_9c0);
          }
          iVar45 = 0;
        }
LAB_002d6504:
      } while (iVar45 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }